

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O0

bool leveldb::GetInternalKey(Slice *input,InternalKey *dst)

{
  bool bVar1;
  undefined1 local_30 [8];
  Slice str;
  InternalKey *dst_local;
  Slice *input_local;
  
  str.size_ = (size_t)dst;
  Slice::Slice((Slice *)local_30);
  bVar1 = GetLengthPrefixedSlice(input,(Slice *)local_30);
  if (bVar1) {
    input_local._7_1_ = InternalKey::DecodeFrom((InternalKey *)str.size_,(Slice *)local_30);
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

static bool GetInternalKey(Slice* input, InternalKey* dst) {
  Slice str;
  if (GetLengthPrefixedSlice(input, &str)) {
    return dst->DecodeFrom(str);
  } else {
    return false;
  }
}